

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

int enet_protocol_handle_send_unreliable_fragment
              (ENetHost *host,ENetPeer *peer,ENetProtocol *command,enet_uint8 **currentData)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t fragmentCount_00;
  uint32_t uVar5;
  uint32_t uVar6;
  ENetChannel *channel_00;
  ENetIncomingCommand *incomingCommand;
  ENetIncomingCommand *startCommand;
  ENetListIterator currentCommand;
  ENetChannel *channel;
  enet_uint16 currentWindow;
  enet_uint16 reliableWindow;
  enet_uint32 totalLength;
  enet_uint32 startSequenceNumber;
  enet_uint32 reliableSequenceNumber;
  enet_uint32 fragmentLength;
  enet_uint32 fragmentOffset;
  enet_uint32 fragmentCount;
  enet_uint32 fragmentNumber;
  enet_uint8 **currentData_local;
  ENetProtocol *command_local;
  ENetPeer *peer_local;
  ENetHost *host_local;
  
  incomingCommand = (ENetIncomingCommand *)0x0;
  if (((ulong)(command->header).channelID < peer->channelCount) &&
     ((peer->state == ENET_PEER_STATE_CONNECTED || (peer->state == ENET_PEER_STATE_DISCONNECT_LATER)
      ))) {
    uVar3 = ntohs((command->acknowledge).receivedSentTime);
    startSequenceNumber = (enet_uint32)uVar3;
    *currentData = *currentData + startSequenceNumber;
    if ((((startSequenceNumber == 0) || (host->maximumPacketSize < (ulong)startSequenceNumber)) ||
        (*currentData < host->receivedData)) ||
       (host->receivedData + host->receivedDataLength < *currentData)) {
      host_local._4_4_ = -1;
    }
    else {
      channel_00 = peer->channels + (command->header).channelID;
      uVar1 = (command->header).reliableSequenceNumber;
      uVar3 = ntohs((command->acknowledge).receivedReliableSequenceNumber);
      channel._2_2_ = uVar1 >> 0xc;
      uVar2 = channel_00->incomingReliableSequenceNumber / 0x1000;
      if (uVar1 < channel_00->incomingReliableSequenceNumber) {
        channel._2_2_ = channel._2_2_ + 0x10;
      }
      if ((channel._2_2_ < uVar2) || ((ushort)(uVar2 + 7) <= channel._2_2_)) {
        host_local._4_4_ = 0;
      }
      else if ((uVar1 == channel_00->incomingReliableSequenceNumber) &&
              (uVar3 <= channel_00->incomingUnreliableSequenceNumber)) {
        host_local._4_4_ = 0;
      }
      else {
        uVar4 = ntohl((command->connect).windowSize);
        fragmentCount_00 = ntohl((command->connect).mtu);
        uVar5 = ntohl((command->connect).incomingBandwidth);
        uVar6 = ntohl((command->connect).channelCount);
        if ((fragmentCount_00 < 0x100001) &&
           ((((uVar4 < fragmentCount_00 && ((ulong)uVar6 <= host->maximumPacketSize)) &&
             (fragmentCount_00 <= uVar6)) &&
            ((uVar5 < uVar6 && (startSequenceNumber <= uVar6 - uVar5)))))) {
          for (startCommand = (ENetIncomingCommand *)
                              (channel_00->incomingUnreliableCommands).sentinel.previous;
              startCommand != (ENetIncomingCommand *)&channel_00->incomingUnreliableCommands;
              startCommand = (ENetIncomingCommand *)(startCommand->incomingCommandList).previous) {
            if (uVar1 < channel_00->incomingReliableSequenceNumber) {
              if (channel_00->incomingReliableSequenceNumber <= startCommand->reliableSequenceNumber
                 ) break;
LAB_0010c418:
              if (startCommand->reliableSequenceNumber < uVar1) break;
              if ((startCommand->reliableSequenceNumber <= uVar1) &&
                 (startCommand->unreliableSequenceNumber <= uVar3)) {
                if (uVar3 <= startCommand->unreliableSequenceNumber) {
                  if (((((startCommand->command).header.command & 0xf) != 0xc) ||
                      ((ulong)uVar6 != startCommand->packet->dataLength)) ||
                     (fragmentCount_00 != startCommand->fragmentCount)) {
                    return -1;
                  }
                  incomingCommand = startCommand;
                }
                break;
              }
            }
            else if (channel_00->incomingReliableSequenceNumber <=
                     startCommand->reliableSequenceNumber) goto LAB_0010c418;
          }
          if ((incomingCommand == (ENetIncomingCommand *)0x0) &&
             (incomingCommand =
                   enet_peer_queue_incoming_command
                             (peer,command,(void *)0x0,(ulong)uVar6,8,fragmentCount_00),
             incomingCommand == (ENetIncomingCommand *)0x0)) {
            host_local._4_4_ = -1;
          }
          else {
            if ((incomingCommand->fragments[uVar4 >> 5] & 1 << ((byte)uVar4 & 0x1f)) == 0) {
              incomingCommand->fragmentsRemaining = incomingCommand->fragmentsRemaining - 1;
              incomingCommand->fragments[uVar4 >> 5] =
                   1 << ((byte)uVar4 & 0x1f) | incomingCommand->fragments[uVar4 >> 5];
              if (incomingCommand->packet->dataLength < (ulong)(uVar5 + startSequenceNumber)) {
                startSequenceNumber = (int)incomingCommand->packet->dataLength - uVar5;
              }
              memcpy(incomingCommand->packet->data + uVar5,&(command->connect).outgoingBandwidth,
                     (ulong)startSequenceNumber);
              if (incomingCommand->fragmentsRemaining == 0) {
                enet_peer_dispatch_incoming_unreliable_commands
                          (peer,channel_00,(ENetIncomingCommand *)0x0);
              }
            }
            host_local._4_4_ = 0;
          }
        }
        else {
          host_local._4_4_ = -1;
        }
      }
    }
  }
  else {
    host_local._4_4_ = -1;
  }
  return host_local._4_4_;
}

Assistant:

static int enet_protocol_handle_send_unreliable_fragment(ENetHost *host, ENetPeer *peer, const ENetProtocol *command, enet_uint8 **currentData) {
        enet_uint32 fragmentNumber, fragmentCount, fragmentOffset, fragmentLength, reliableSequenceNumber, startSequenceNumber, totalLength;
        enet_uint16 reliableWindow, currentWindow;
        ENetChannel *channel;
        ENetListIterator currentCommand;
        ENetIncomingCommand *startCommand = NULL;

        if (command->header.channelID >= peer->channelCount || (peer->state != ENET_PEER_STATE_CONNECTED && peer->state != ENET_PEER_STATE_DISCONNECT_LATER)) {
            return -1;
        }

        fragmentLength = ENET_NET_TO_HOST_16(command->sendFragment.dataLength);
        *currentData  += fragmentLength;
        if (fragmentLength <= 0 ||
            fragmentLength > host->maximumPacketSize ||
            *currentData < host->receivedData ||
            *currentData > &host->receivedData[host->receivedDataLength]
        ) {
            return -1;
        }

        channel = &peer->channels[command->header.channelID];
        reliableSequenceNumber = command->header.reliableSequenceNumber;
        startSequenceNumber    = ENET_NET_TO_HOST_16(command->sendFragment.startSequenceNumber);

        reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
        currentWindow  = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

        if (reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
            reliableWindow += ENET_PEER_RELIABLE_WINDOWS;
        }

        if (reliableWindow < currentWindow || reliableWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1) {
            return 0;
        }

        if (reliableSequenceNumber == channel->incomingReliableSequenceNumber && startSequenceNumber <= channel->incomingUnreliableSequenceNumber) {
            return 0;
        }

        fragmentNumber = ENET_NET_TO_HOST_32(command->sendFragment.fragmentNumber);
        fragmentCount  = ENET_NET_TO_HOST_32(command->sendFragment.fragmentCount);
        fragmentOffset = ENET_NET_TO_HOST_32(command->sendFragment.fragmentOffset);
        totalLength    = ENET_NET_TO_HOST_32(command->sendFragment.totalLength);

        if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT ||
            fragmentNumber >= fragmentCount ||
            totalLength > host->maximumPacketSize ||
            totalLength < fragmentCount ||
            fragmentOffset >= totalLength ||
            fragmentLength > totalLength - fragmentOffset
        ) {
            return -1;
        }

        for (currentCommand = enet_list_previous(enet_list_end(&channel->incomingUnreliableCommands));
            currentCommand != enet_list_end(&channel->incomingUnreliableCommands);
            currentCommand = enet_list_previous(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
                    continue;
                }
            } else if (incomingCommand->reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber < reliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber > reliableSequenceNumber) {
                continue;
            }

            if (incomingCommand->unreliableSequenceNumber <= startSequenceNumber) {
                if (incomingCommand->unreliableSequenceNumber < startSequenceNumber) {
                    break;
                }

                if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) !=
                    ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE_FRAGMENT ||
                    totalLength != incomingCommand->packet->dataLength ||
                    fragmentCount != incomingCommand->fragmentCount
                ) {
                    return -1;
                }

                startCommand = incomingCommand;
                break;
            }
        }

        if (startCommand == NULL) {
            startCommand = enet_peer_queue_incoming_command(peer, command, NULL, totalLength,
                ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT, fragmentCount);
            if (startCommand == NULL) {
                return -1;
            }
        }

        if ((startCommand->fragments[fragmentNumber / 32] & (1u << (fragmentNumber % 32))) == 0) {
            --startCommand->fragmentsRemaining;
            startCommand->fragments[fragmentNumber / 32] |= (1u << (fragmentNumber % 32));

            if (fragmentOffset + fragmentLength > startCommand->packet->dataLength) {
                fragmentLength = startCommand->packet->dataLength - fragmentOffset;
            }

            memcpy(startCommand->packet->data + fragmentOffset, (enet_uint8 *) command + sizeof(ENetProtocolSendFragment), fragmentLength);

            if (startCommand->fragmentsRemaining <= 0) {
                enet_peer_dispatch_incoming_unreliable_commands(peer, channel, NULL);
            }
        }

        return 0;
    }